

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * dmrC_parens_expression(dmr_C *C,token *token,expression **expr,char *where)

{
  int iVar1;
  token *ptVar2;
  expression *peVar3;
  statement *stmt_00;
  statement *stmt;
  expression *e;
  char *where_local;
  expression **expr_local;
  token *token_local;
  dmr_C *C_local;
  
  ptVar2 = dmrC_expect_token(C,token,0x28,where);
  iVar1 = dmrC_match_op(ptVar2,0x7b);
  if (iVar1 == 0) {
    expr_local = (expression **)dmrC_parse_expression(C,ptVar2,expr);
  }
  else {
    peVar3 = dmrC_alloc_expression(C,ptVar2->pos,0x13);
    stmt_00 = dmrC_alloc_statement(C,ptVar2->pos,3);
    *expr = peVar3;
    (peVar3->field_5).statement = stmt_00;
    dmrC_start_symbol_scope(C);
    ptVar2 = dmrC_compound_statement(C,ptVar2->next,stmt_00);
    dmrC_end_symbol_scope(C);
    expr_local = (expression **)dmrC_expect_token(C,ptVar2,0x7d,"at end of statement expression");
  }
  ptVar2 = dmrC_expect_token(C,(token *)expr_local,0x29,where);
  return ptVar2;
}

Assistant:

struct token *dmrC_parens_expression(struct dmr_C *C, struct token *token, struct expression **expr, const char *where)
{
	token = dmrC_expect_token(C, token, '(', where);
	if (dmrC_match_op(token, '{')) {
		struct expression *e = dmrC_alloc_expression(C, token->pos, EXPR_STATEMENT);
		struct statement *stmt = dmrC_alloc_statement(C, token->pos, STMT_COMPOUND);
		*expr = e;
		e->statement = stmt;
		dmrC_start_symbol_scope(C);
		token = dmrC_compound_statement(C, token->next, stmt);
		dmrC_end_symbol_scope(C);
		token = dmrC_expect_token(C, token, '}', "at end of statement expression");
	} else
		token = dmrC_parse_expression(C, token, expr);
	return dmrC_expect_token(C, token, ')', where);
}